

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::UpdateDefaultConfigPSKc
          (Error *__return_storage_ptr__,JobManager *this,ByteArray *aPSKc)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  string local_b8;
  writer local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 local_68 [40];
  parse_func local_40 [1];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if ((ulong)((long)(aPSKc->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(aPSKc->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < 0x11) {
    iVar2 = (*(((this->mDefaultCommissioner).
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
    if ((char)iVar2 == '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(this->mDefaultConf).mPSKc,aPSKc);
      CommissionerAppCreate((Error *)local_68,&this->mDefaultCommissioner,&this->mDefaultConf);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_68 + 0x18);
      goto LAB_001fbff9;
    }
    local_68._0_4_ = none_type;
    pcVar3 = "cannot set PSKc when the commissioner is active";
    local_68._8_8_ = "cannot set PSKc when the commissioner is active";
    local_68._16_8_ = 0x2f;
    local_68._24_8_ = 0;
    local_40[0] = (parse_func)0x0;
    local_98.handler_ = (format_string_checker<char> *)local_68;
    local_68._32_8_ = (format_string_checker<char> *)local_68;
    do {
      cVar1 = *pcVar3;
      pcVar5 = pcVar3;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_98,pcVar3,"");
          goto LAB_001fbf88;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_98,pcVar3,pcVar5);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",(format_string_checker<char> *)local_68);
    } while (pcVar3 != "");
LAB_001fbf88:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot set PSKc when the commissioner is active",
               (string_view)ZEXT816(0x2f),args_00);
    local_90 = kInvalidState;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_90;
  }
  else {
    local_68._0_4_ = none_type;
    local_68._8_8_ = "invalid PSKc length";
    local_68._16_8_ = 0x13;
    local_68._24_8_ = 0;
    local_40[0] = (parse_func)0x0;
    pcVar3 = "invalid PSKc length";
    local_68._32_8_ = (format_string_checker<char> *)local_68;
    do {
      pcVar5 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",(format_string_checker<char> *)local_68);
      }
      pcVar3 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"invalid PSKc length",(string_view)ZEXT816(0x13),args);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_90;
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  paVar4 = &local_b8.field_2;
LAB_001fbff9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
    operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2]);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::UpdateDefaultConfigPSKc(const ByteArray &aPSKc)
{
    Error error;

    VerifyOrExit(aPSKc.size() <= kMaxPSKcLength, error = ERROR_INVALID_ARGS("invalid PSKc length"));
    VerifyOrExit(!mDefaultCommissioner->IsActive(),
                 error = ERROR_INVALID_STATE("cannot set PSKc when the commissioner is active"));

    mDefaultConf.mPSKc = aPSKc;
    CommissionerAppCreate(mDefaultCommissioner, mDefaultConf).IgnoreError();

exit:
    return error;
}